

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O0

shared_ptr<vera::BVH> __thiscall
vera::BVH::hit(BVH *this,Ray *_ray,float *_minDistance,float *_maxDistance)

{
  bool bVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  float *in_R8;
  shared_ptr<vera::BVH> sVar4;
  undefined1 local_78 [8];
  shared_ptr<vera::BVH> right_hit;
  float right_maxT;
  float right_minT;
  shared_ptr<vera::BVH> left_hit;
  float left_maxT;
  float left_minT;
  undefined8 local_40;
  undefined8 local_38;
  float *local_30;
  float *_maxDistance_local;
  float *_minDistance_local;
  Ray *_ray_local;
  BVH *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  _left_maxT = *(undefined8 *)(_ray + 8);
  local_40 = *(undefined8 *)(_ray + 0x10);
  local_38 = *(undefined8 *)(_ray + 0x18);
  local_30 = in_R8;
  _maxDistance_local = _maxDistance;
  _minDistance_local = _minDistance;
  _ray_local = _ray;
  this_local = this;
  bVar1 = intersection((Ray *)_minDistance,(BoundingBox *)&left_maxT,_maxDistance,in_R8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    if (((byte)_ray[0x60] & 1) == 0) {
      left_hit.super___shared_ptr<vera::BVH,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           *_maxDistance_local;
      left_hit.super___shared_ptr<vera::BVH,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
           *local_30;
      peVar2 = std::__shared_ptr_access<vera::BVH,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<vera::BVH,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(_ray + 0x38));
      (*peVar2->_vptr_BVH[3])
                (&right_maxT,peVar2,_minDistance_local,
                 (undefined1 *)
                 ((long)&left_hit.super___shared_ptr<vera::BVH,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 4),
                 &left_hit.super___shared_ptr<vera::BVH,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      right_hit.super___shared_ptr<vera::BVH,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           *_maxDistance_local;
      right_hit.super___shared_ptr<vera::BVH,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
           *local_30;
      peVar2 = std::__shared_ptr_access<vera::BVH,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<vera::BVH,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(_ray + 0x48));
      (*peVar2->_vptr_BVH[3])
                (local_78,peVar2,_minDistance_local,
                 (undefined1 *)
                 ((long)&right_hit.super___shared_ptr<vera::BVH,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 4),
                 &right_hit.super___shared_ptr<vera::BVH,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      bVar1 = std::operator!=((shared_ptr<vera::BVH> *)&right_maxT,(nullptr_t)0x0);
      if ((bVar1) &&
         (bVar1 = std::operator!=((shared_ptr<vera::BVH> *)local_78,(nullptr_t)0x0), bVar1)) {
        std::make_shared<vera::BVH,vera::BVH&>(this);
      }
      else {
        bVar1 = std::operator!=((shared_ptr<vera::BVH> *)&right_maxT,(nullptr_t)0x0);
        if (bVar1) {
          std::shared_ptr<vera::BVH>::shared_ptr
                    ((shared_ptr<vera::BVH> *)this,(shared_ptr<vera::BVH> *)&right_maxT);
        }
        else {
          bVar1 = std::operator!=((shared_ptr<vera::BVH> *)local_78,(nullptr_t)0x0);
          if (bVar1) {
            std::shared_ptr<vera::BVH>::shared_ptr
                      ((shared_ptr<vera::BVH> *)this,(shared_ptr<vera::BVH> *)local_78);
          }
          else {
            std::shared_ptr<vera::BVH>::shared_ptr((shared_ptr<vera::BVH> *)this,(nullptr_t)0x0);
          }
        }
      }
      std::shared_ptr<vera::BVH>::~shared_ptr((shared_ptr<vera::BVH> *)local_78);
      std::shared_ptr<vera::BVH>::~shared_ptr((shared_ptr<vera::BVH> *)&right_maxT);
      _Var3._M_pi = extraout_RDX_00;
    }
    else {
      sVar4 = std::make_shared<vera::BVH,vera::BVH&>(this);
      _Var3 = sVar4.super___shared_ptr<vera::BVH,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
  }
  else {
    std::shared_ptr<vera::BVH>::shared_ptr((shared_ptr<vera::BVH> *)this,(nullptr_t)0x0);
    _Var3._M_pi = extraout_RDX;
  }
  sVar4.super___shared_ptr<vera::BVH,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<vera::BVH,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<vera::BVH>)sVar4.super___shared_ptr<vera::BVH,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BVH> BVH::hit(const Ray& _ray, float& _minDistance, float& _maxDistance) {
    if ( !intersection(_ray, (BoundingBox)*this, _minDistance, _maxDistance) )
        return nullptr;

    if (!leaf) {
        float left_minT = _minDistance;
        float left_maxT = _maxDistance;
        std::shared_ptr<BVH> left_hit = left->hit(_ray, left_minT, left_maxT);

        float right_minT = _minDistance;
        float right_maxT = _maxDistance;
        std::shared_ptr<BVH> right_hit = right->hit(_ray, right_minT, right_maxT);

        if (left_hit != nullptr && right_hit != nullptr)
            return std::make_shared<BVH>( *this );
        else if (left_hit != nullptr) 
            return left_hit;
        else if (right_hit != nullptr)
            return right_hit;

        return nullptr;
    }
    else
        return std::make_shared<BVH>( *this );
}